

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O2

void __thiscall HTimer::report(HTimer *this,int itemCount,int *itemList)

{
  double dVar1;
  undefined8 uVar2;
  ulong uVar3;
  int i;
  
  uVar2 = rdtsc();
  dVar1 = this->startTick;
  printf("profile-name ");
  if (itemCount < 1) {
    itemCount = 0;
  }
  for (uVar3 = 0; (uint)itemCount != uVar3; uVar3 = uVar3 + 1) {
    printf(" %s",this->itemNames[itemList[uVar3]]._M_dataplus._M_p);
  }
  putchar(10);
  printf("profile-item ");
  for (uVar3 = 0; (uint)itemCount != uVar3; uVar3 = uVar3 + 1) {
    printf(" %3d",(ulong)(uint)(int)((this->itemTicks[itemList[uVar3]] * 1000.0) /
                                    ((((double)CONCAT44(0x45300000,(int)((ulong)uVar2 >> 0x20)) -
                                      1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))
                                    - dVar1)));
  }
  putchar(10);
  return;
}

Assistant:

void report(int itemCount, int *itemList) {
        double totalTick = getTick();
        printf("profile-name ");
        for (int i = 0; i < itemCount; i++)
            printf(" %s", itemNames[itemList[i]].c_str());
        printf("\n");
        printf("profile-item ");
        for (int i = 0; i < itemCount; i++) {
            int percent = 1000.0 * itemTicks[itemList[i]] / totalTick;
            printf(" %3d", percent);
        }
        printf("\n");
    }